

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O1

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenPackUnPack_ObjectAPI
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,IDLOptions *opts,
          bool struct_has_create,
          set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
          *field_has_create)

{
  Value *pVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BaseType BVar3;
  FieldDef *pFVar4;
  StructDef *pSVar5;
  pointer pcVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  undefined8 *puVar10;
  _Base_ptr p_Var11;
  size_type *psVar12;
  undefined8 *puVar13;
  long *plVar14;
  _Base_ptr p_Var15;
  char *pcVar16;
  string *psVar17;
  pointer ppFVar18;
  char *pcVar19;
  undefined8 uVar20;
  _Alloc_hider _Var21;
  undefined7 in_register_00000081;
  string type_name;
  string length_str;
  string create_string_1;
  string camel_name_short;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string camel_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> start;
  string struct_name;
  undefined1 local_378 [24];
  uint16_t uStack_360;
  undefined6 uStack_35e;
  undefined1 local_349;
  string local_348;
  string local_328;
  string *local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  value_type local_2a0;
  string local_278;
  string local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  IDLOptions *local_1d8;
  undefined4 local_1cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  StructDef *local_1a8;
  _Base_ptr local_1a0;
  string local_198;
  set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
  *local_178;
  string local_170;
  string local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_1cc = (undefined4)CONCAT71(in_register_00000081,struct_has_create);
  local_308 = code_ptr;
  local_1d8 = opts;
  local_178 = field_has_create;
  GenTypeName_ObjectAPI(&local_90,this,(string *)struct_def,opts);
  std::operator+(&local_300,"  public ",&local_90);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_300);
  local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_2a0.name.field_2._M_allocated_capacity = *psVar12;
    local_2a0.name.field_2._8_8_ = plVar9[3];
  }
  else {
    local_2a0.name.field_2._M_allocated_capacity = *psVar12;
    local_2a0.name._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2a0.name._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2a0.name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
    operator_delete(local_2a0.name._M_dataplus._M_p,local_2a0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_300,"    var _o = new ",&local_90);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_300);
  local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_2a0.name.field_2._M_allocated_capacity = *psVar12;
    local_2a0.name.field_2._8_8_ = plVar9[3];
  }
  else {
    local_2a0.name.field_2._M_allocated_capacity = *psVar12;
    local_2a0.name._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2a0.name._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2a0.name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
    operator_delete(local_2a0.name._M_dataplus._M_p,local_2a0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  psVar17 = local_308;
  std::__cxx11::string::append((char *)local_308);
  std::__cxx11::string::append((char *)psVar17);
  std::__cxx11::string::append((char *)psVar17);
  std::operator+(&local_300,"  public void UnPackTo(",&local_90);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_300);
  local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_2a0.name.field_2._M_allocated_capacity = *psVar12;
    local_2a0.name.field_2._8_8_ = plVar9[3];
  }
  else {
    local_2a0.name.field_2._M_allocated_capacity = *psVar12;
    local_2a0.name._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2a0.name._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2a0.name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
    operator_delete(local_2a0.name._M_dataplus._M_p,local_2a0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  for (ppFVar18 = (struct_def->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppFVar18 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar18 = ppFVar18 + 1) {
    pFVar4 = *ppFVar18;
    if (pFVar4->deprecated == false) {
      Name_abi_cxx11_(&local_2a0.name,this,pFVar4);
      if ((local_2a0.name._M_string_length == (struct_def->super_Definition).name._M_string_length)
         && ((local_2a0.name._M_string_length == 0 ||
             (iVar8 = bcmp(local_2a0.name._M_dataplus._M_p,
                           (struct_def->super_Definition).name._M_dataplus._M_p,
                           local_2a0.name._M_string_length), iVar8 == 0)))) {
        std::__cxx11::string::append((char *)&local_2a0);
      }
      Name_abi_cxx11_(&local_300,this,pFVar4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                     "    _o.",&local_2a0.name);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_378);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_258.field_2._M_allocated_capacity = *psVar12;
        local_258.field_2._8_8_ = plVar9[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar12;
        local_258._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_258._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
        operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
      }
      BVar3 = (pFVar4->value).type.base_type;
      if (BVar3 - BASE_TYPE_VECTOR < 4) {
        pVVar1 = &pFVar4->value;
        switch(BVar3) {
        case BASE_TYPE_VECTOR:
          BVar3 = (pFVar4->value).type.element;
          if (BVar3 != BASE_TYPE_UTYPE) {
            if (BVar3 == BASE_TYPE_UNION) {
              local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2c0,local_258._M_dataplus._M_p,
                         local_258._M_dataplus._M_p + local_258._M_string_length);
              std::__cxx11::string::append((char *)&local_2c0);
              GenTypeGet_ObjectAPI_abi_cxx11_(&local_328,this,pVVar1->type,local_1d8);
              uVar20 = (EnumDef *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                uVar20 = local_2c0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar20 <
                  (EnumDef *)(local_328._M_string_length + local_2c0._M_string_length)) {
                uVar20 = (EnumDef *)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._M_dataplus._M_p != &local_328.field_2) {
                  uVar20 = local_328.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar20 <
                    (EnumDef *)(local_328._M_string_length + local_2c0._M_string_length))
                goto LAB_001b97d4;
                puVar10 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_328,0,(char *)0x0,
                                     (ulong)local_2c0._M_dataplus._M_p);
              }
              else {
LAB_001b97d4:
                puVar10 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_2c0,(ulong)local_328._M_dataplus._M_p);
              }
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              puVar13 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar13) {
                local_348.field_2._M_allocated_capacity = *puVar13;
                local_348.field_2._8_8_ = puVar10[3];
              }
              else {
                local_348.field_2._M_allocated_capacity = *puVar13;
                local_348._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_348._M_string_length = puVar10[1];
              *puVar10 = puVar13;
              puVar10[1] = 0;
              *(undefined1 *)puVar13 = 0;
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_348);
              local_378._0_8_ = local_378 + 0x10;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((size_type *)*plVar9 == psVar12) {
                local_378._16_8_ = *psVar12;
                _uStack_360 = plVar9[3];
              }
              else {
                local_378._16_8_ = *psVar12;
                local_378._0_8_ = (size_type *)*plVar9;
              }
              local_378._8_8_ = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
              if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
                operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                (ulong)(local_348.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                operator_delete(local_328._M_dataplus._M_p,
                                (ulong)(local_328.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                operator_delete(local_2c0._M_dataplus._M_p,
                                (ulong)(local_2c0.field_2._M_allocated_capacity + 1));
              }
              std::operator+(&local_348,"    for (var _j = 0; _j < this.",&local_2a0.name);
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
              local_378._0_8_ = local_378 + 0x10;
              puVar13 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar13) {
                local_378._16_8_ = *puVar13;
                _uStack_360 = puVar10[3];
              }
              else {
                local_378._16_8_ = *puVar13;
                local_378._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar10;
              }
              local_378._8_8_ = puVar10[1];
              *puVar10 = puVar13;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
              if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
                operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                (ulong)(local_348.field_2._M_allocated_capacity + 1));
              }
              GenUnionUnPack_ObjectAPI
                        (this,(pFVar4->value).type.enum_def,local_308,&local_2a0.name,&local_300,
                         true);
              std::__cxx11::string::append((char *)local_308);
            }
            else {
              pSVar5 = (pFVar4->value).type.struct_def;
              local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2c0,local_258._M_dataplus._M_p,
                         local_258._M_dataplus._M_p + local_258._M_string_length);
              std::__cxx11::string::append((char *)&local_2c0);
              GenTypeGet_ObjectAPI_abi_cxx11_(&local_328,this,pVVar1->type,local_1d8);
              uVar20 = (EnumDef *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                uVar20 = local_2c0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar20 <
                  (EnumDef *)(local_328._M_string_length + local_2c0._M_string_length)) {
                uVar20 = (EnumDef *)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._M_dataplus._M_p != &local_328.field_2) {
                  uVar20 = local_328.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar20 <
                    (EnumDef *)(local_328._M_string_length + local_2c0._M_string_length))
                goto LAB_001b9cdc;
                puVar10 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_328,0,(char *)0x0,
                                     (ulong)local_2c0._M_dataplus._M_p);
              }
              else {
LAB_001b9cdc:
                puVar10 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_2c0,(ulong)local_328._M_dataplus._M_p);
              }
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              puVar13 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar13) {
                local_348.field_2._M_allocated_capacity = *puVar13;
                local_348.field_2._8_8_ = puVar10[3];
              }
              else {
                local_348.field_2._M_allocated_capacity = *puVar13;
                local_348._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_348._M_string_length = puVar10[1];
              *puVar10 = puVar13;
              puVar10[1] = 0;
              *(undefined1 *)puVar13 = 0;
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_348);
              local_378._0_8_ = local_378 + 0x10;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((size_type *)*plVar9 == psVar12) {
                local_378._16_8_ = *psVar12;
                _uStack_360 = plVar9[3];
              }
              else {
                local_378._16_8_ = *psVar12;
                local_378._0_8_ = (size_type *)*plVar9;
              }
              local_378._8_8_ = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
              if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
                operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                (ulong)(local_348.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                operator_delete(local_328._M_dataplus._M_p,
                                (ulong)(local_328.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                operator_delete(local_2c0._M_dataplus._M_p,
                                (ulong)(local_2c0.field_2._M_allocated_capacity + 1));
              }
              std::operator+(&local_348,"    for (var _j = 0; _j < this.",&local_2a0.name);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_348);
              local_378._0_8_ = local_378 + 0x10;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((size_type *)*plVar9 == psVar12) {
                local_378._16_8_ = *psVar12;
                _uStack_360 = plVar9[3];
              }
              else {
                local_378._16_8_ = *psVar12;
                local_378._0_8_ = (size_type *)*plVar9;
              }
              local_378._8_8_ = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
              if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
                operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                (ulong)(local_348.field_2._M_allocated_capacity + 1));
              }
              std::operator+(&local_348,"_o.",&local_2a0.name);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_348);
              local_378._0_8_ = local_378 + 0x10;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((size_type *)*plVar9 == psVar12) {
                local_378._16_8_ = *psVar12;
                _uStack_360 = plVar9[3];
              }
              else {
                local_378._16_8_ = *psVar12;
                local_378._0_8_ = (size_type *)*plVar9;
              }
              local_378._8_8_ = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
              if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
                operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                (ulong)(local_348.field_2._M_allocated_capacity + 1));
              }
              if (pSVar5 == (StructDef *)0x0) {
                std::operator+(&local_348,"this.",&local_2a0.name);
                puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
                puVar13 = puVar10 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar13) {
                  local_378._16_8_ = *puVar13;
                  _uStack_360 = puVar10[3];
                  local_378._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_378 + 0x10);
                }
                else {
                  local_378._16_8_ = *puVar13;
                  local_378._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar10;
                }
                local_378._8_8_ = puVar10[1];
                *puVar10 = puVar13;
                puVar10[1] = 0;
                *(undefined1 *)(puVar10 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_378._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_378 + 0x10)) {
                  operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
                }
                uVar20 = local_348.field_2._M_allocated_capacity;
                _Var21._M_p = local_348._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p != &local_348.field_2) goto LAB_001bade2;
              }
              else {
                std::operator+(&local_328,"this.",&local_2a0.name);
                puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
                local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
                puVar13 = puVar10 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar13) {
                  local_2c0.field_2._M_allocated_capacity = *puVar13;
                  local_2c0.field_2._8_8_ = puVar10[3];
                }
                else {
                  local_2c0.field_2._M_allocated_capacity = *puVar13;
                  local_2c0._M_dataplus._M_p = (pointer)*puVar10;
                }
                local_2c0._M_string_length = puVar10[1];
                *puVar10 = puVar13;
                puVar10[1] = 0;
                *(undefined1 *)(puVar10 + 2) = 0;
                puVar10 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_2c0,(ulong)local_2a0.name._M_dataplus._M_p);
                puVar13 = puVar10 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar13) {
                  local_348.field_2._M_allocated_capacity = *puVar13;
                  local_348.field_2._8_8_ = puVar10[3];
                  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
                }
                else {
                  local_348.field_2._M_allocated_capacity = *puVar13;
                  local_348._M_dataplus._M_p = (pointer)*puVar10;
                }
                local_348._M_string_length = puVar10[1];
                *puVar10 = puVar13;
                puVar10[1] = 0;
                *(undefined1 *)(puVar10 + 2) = 0;
                puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
                puVar13 = puVar10 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar13) {
                  local_378._16_8_ = *puVar13;
                  _uStack_360 = puVar10[3];
                  local_378._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_378 + 0x10);
                }
                else {
                  local_378._16_8_ = *puVar13;
                  local_378._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar10;
                }
                local_378._8_8_ = puVar10[1];
                *puVar10 = puVar13;
                puVar10[1] = 0;
                *(undefined1 *)(puVar10 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_378._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_378 + 0x10)) {
                  operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p != &local_348.field_2) {
                  operator_delete(local_348._M_dataplus._M_p,
                                  (ulong)(local_348.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                  operator_delete(local_2c0._M_dataplus._M_p,
                                  (ulong)(local_2c0.field_2._M_allocated_capacity + 1));
                }
                uVar20 = local_328.field_2._M_allocated_capacity;
                _Var21._M_p = local_328._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._M_dataplus._M_p != &local_328.field_2) {
LAB_001bade2:
                  operator_delete(_Var21._M_p,
                                  (ulong)((long)&(((EnumDef *)uVar20)->super_Definition).name.
                                                 _M_dataplus._M_p + 1));
                }
              }
              std::__cxx11::string::append((char *)local_308);
            }
          }
          break;
        case BASE_TYPE_STRUCT:
          if ((struct_def->fixed == true) && (((pFVar4->value).type.struct_def)->fixed == true)) {
            local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2c0,local_258._M_dataplus._M_p,
                       local_258._M_dataplus._M_p + local_258._M_string_length);
            std::__cxx11::string::append((char *)&local_2c0);
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_2c0,(ulong)local_2a0.name._M_dataplus._M_p);
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_348.field_2._M_allocated_capacity = *puVar13;
              local_348.field_2._8_8_ = puVar10[3];
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            }
            else {
              local_348.field_2._M_allocated_capacity = *puVar13;
              local_348._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_348._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_378._16_8_ = *puVar13;
              _uStack_360 = puVar10[3];
              local_378._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_378 + 0x10);
            }
            else {
              local_378._16_8_ = *puVar13;
              local_378._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar10;
            }
            local_378._8_8_ = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
            goto LAB_001b9bbd;
          }
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e0,local_258._M_dataplus._M_p,
                     local_258._M_dataplus._M_p + local_258._M_string_length);
          std::__cxx11::string::append((char *)&local_2e0);
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_2e0,(ulong)local_2a0.name._M_dataplus._M_p);
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_328.field_2._M_allocated_capacity = *puVar13;
            local_328.field_2._8_8_ = puVar10[3];
          }
          else {
            local_328.field_2._M_allocated_capacity = *puVar13;
            local_328._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_328._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_2c0.field_2._M_allocated_capacity = *puVar13;
            local_2c0.field_2._8_8_ = puVar10[3];
          }
          else {
            local_2c0.field_2._M_allocated_capacity = *puVar13;
            local_2c0._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_2c0._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_2c0,(ulong)local_2a0.name._M_dataplus._M_p);
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_348.field_2._M_allocated_capacity = *puVar13;
            local_348.field_2._8_8_ = puVar10[3];
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          }
          else {
            local_348.field_2._M_allocated_capacity = *puVar13;
            local_348._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_348._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_378._16_8_ = *puVar13;
            _uStack_360 = puVar10[3];
            local_378._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_378 + 0x10);
          }
          else {
            local_378._16_8_ = *puVar13;
            local_378._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar10;
          }
          local_378._8_8_ = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_378 + 0x10)) {
            operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,
                            (ulong)(local_348.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,
                            (ulong)(local_2c0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,
                            (ulong)(local_328.field_2._M_allocated_capacity + 1));
          }
          uVar20 = local_2e0.field_2._M_allocated_capacity;
          _Var21._M_p = local_2e0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) goto LAB_001ba548;
          break;
        case BASE_TYPE_UNION:
          GenUnionUnPack_ObjectAPI
                    (this,(pFVar4->value).type.enum_def,local_308,&local_2a0.name,&local_300,false);
          break;
        case BASE_TYPE_ARRAY:
          GenTypeGet_ObjectAPI_abi_cxx11_((string *)local_378,this,pVVar1->type,local_1d8);
          NumToString<unsigned_short>(&local_348,(pFVar4->value).type.fixed_length);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,local_258._M_dataplus._M_p,
                     local_258._M_dataplus._M_p + local_258._M_string_length);
          std::__cxx11::string::append((char *)&local_278);
          std::__cxx11::string::substr((ulong)&local_238,(ulong)local_378);
          uVar20 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            uVar20 = local_278.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar20 < (EnumDef *)(local_238._M_string_length + local_278._M_string_length))
          {
            uVar20 = (EnumDef *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              uVar20 = local_238.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar20 < (EnumDef *)(local_238._M_string_length + local_278._M_string_length)
               ) goto LAB_001b99d2;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_238,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
          }
          else {
LAB_001b99d2:
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_278,(ulong)local_238._M_dataplus._M_p);
          }
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          psVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_2e0.field_2._M_allocated_capacity = *psVar12;
            local_2e0.field_2._8_8_ = puVar10[3];
          }
          else {
            local_2e0.field_2._M_allocated_capacity = *psVar12;
            local_2e0._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_2e0._M_string_length = puVar10[1];
          *puVar10 = psVar12;
          puVar10[1] = 0;
          *(undefined1 *)psVar12 = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_2e0,(ulong)local_348._M_dataplus._M_p);
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_328.field_2._M_allocated_capacity = *psVar12;
            local_328.field_2._8_8_ = plVar9[3];
          }
          else {
            local_328.field_2._M_allocated_capacity = *psVar12;
            local_328._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_328._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_2c0.field_2._M_allocated_capacity = *psVar12;
            local_2c0.field_2._8_8_ = plVar9[3];
          }
          else {
            local_2c0.field_2._M_allocated_capacity = *psVar12;
            local_2c0._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_2c0._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2c0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,
                            (ulong)(local_238.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,
                            (ulong)(local_278.field_2._M_allocated_capacity + 1));
          }
          std::operator+(&local_1c8,"    for (var _j = 0; _j < ",&local_348);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_1f8.field_2._M_allocated_capacity = *puVar13;
            local_1f8.field_2._8_8_ = puVar10[3];
          }
          else {
            local_1f8.field_2._M_allocated_capacity = *puVar13;
            local_1f8._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_1f8._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1f8,(ulong)local_2a0.name._M_dataplus._M_p);
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          plVar14 = plVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar14) {
            local_218.field_2._M_allocated_capacity = *plVar14;
            local_218.field_2._8_8_ = plVar9[3];
          }
          else {
            local_218.field_2._M_allocated_capacity = *plVar14;
            local_218._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_218._M_string_length = plVar9[1];
          *plVar9 = (long)plVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_218);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_238.field_2._M_allocated_capacity = *puVar13;
            local_238.field_2._8_8_ = puVar10[3];
          }
          else {
            local_238.field_2._M_allocated_capacity = *puVar13;
            local_238._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_238._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_238,(ulong)local_2a0.name._M_dataplus._M_p);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          plVar14 = plVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar14) {
            local_278.field_2._M_allocated_capacity = *plVar14;
            local_278.field_2._8_8_ = plVar9[3];
          }
          else {
            local_278.field_2._M_allocated_capacity = *plVar14;
            local_278._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_278._M_string_length = plVar9[1];
          *plVar9 = (long)plVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_2e0.field_2._M_allocated_capacity = *puVar13;
            local_2e0.field_2._8_8_ = puVar10[3];
          }
          else {
            local_2e0.field_2._M_allocated_capacity = *puVar13;
            local_2e0._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_2e0._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_328.field_2._M_allocated_capacity = *puVar13;
            local_328.field_2._8_8_ = puVar10[3];
          }
          else {
            local_328.field_2._M_allocated_capacity = *puVar13;
            local_328._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_328._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_2c0.field_2._M_allocated_capacity = *puVar13;
            local_2c0.field_2._8_8_ = puVar10[3];
          }
          else {
            local_2c0.field_2._M_allocated_capacity = *puVar13;
            local_2c0._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_2c0._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2c0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,
                            (ulong)(local_2c0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,
                            (ulong)(local_328.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,
                            (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,
                            (ulong)(local_278.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,
                            (ulong)(local_238.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,
                            (ulong)(local_218.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,
                            (ulong)(local_1f8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,
                            (ulong)(local_1c8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,
                            (ulong)(local_348.field_2._M_allocated_capacity + 1));
          }
          uVar20 = local_378._16_8_;
          _Var21._M_p = (pointer)local_378._0_8_;
          if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) goto LAB_001ba548;
        }
      }
      else if (BVar3 != BASE_TYPE_UTYPE) {
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c0,local_258._M_dataplus._M_p,
                   local_258._M_dataplus._M_p + local_258._M_string_length);
        std::__cxx11::string::append((char *)&local_2c0);
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_2c0,(ulong)local_2a0.name._M_dataplus._M_p);
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_348.field_2._M_allocated_capacity = *puVar13;
          local_348.field_2._8_8_ = puVar10[3];
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        }
        else {
          local_348.field_2._M_allocated_capacity = *puVar13;
          local_348._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_348._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_378._16_8_ = *puVar13;
          _uStack_360 = puVar10[3];
          local_378._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_378 + 0x10);
        }
        else {
          local_378._16_8_ = *puVar13;
          local_378._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar10;
        }
        local_378._8_8_ = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
LAB_001b9bbd:
        if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
          operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,
                          (ulong)(local_348.field_2._M_allocated_capacity + 1));
        }
        uVar20 = local_2c0.field_2._M_allocated_capacity;
        _Var21._M_p = local_2c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
LAB_001ba548:
          operator_delete(_Var21._M_p,
                          (ulong)((long)&(((EnumDef *)uVar20)->super_Definition).name._M_dataplus.
                                         _M_p + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
        operator_delete(local_2a0.name._M_dataplus._M_p,
                        local_2a0.name.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__cxx11::string::append((char *)local_308);
  GenOffsetType_abi_cxx11_(&local_348,this,struct_def);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_348,0,(char *)0x0,0x36df5c);
  local_378._0_8_ = local_378 + 0x10;
  plVar14 = plVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar14) {
    local_378._16_8_ = *plVar14;
    _uStack_360 = plVar9[3];
  }
  else {
    local_378._16_8_ = *plVar14;
    local_378._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar9;
  }
  local_378._8_8_ = plVar9[1];
  *plVar9 = (long)plVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append(local_378);
  paVar2 = &local_258.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_258.field_2._M_allocated_capacity = *psVar12;
    local_258.field_2._8_8_ = plVar9[3];
    local_258._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar12;
    local_258._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_258._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_258,(ulong)local_90._M_dataplus._M_p);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_300.field_2._M_allocated_capacity = *psVar12;
    local_300.field_2._8_8_ = plVar9[3];
  }
  else {
    local_300.field_2._M_allocated_capacity = *psVar12;
    local_300._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_300._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_300);
  local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_2a0.name.field_2._M_allocated_capacity = *psVar12;
    local_2a0.name.field_2._8_8_ = plVar9[3];
  }
  else {
    local_2a0.name.field_2._M_allocated_capacity = *psVar12;
    local_2a0.name._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2a0.name._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2a0.name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
    operator_delete(local_2a0.name._M_dataplus._M_p,local_2a0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
    operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,(ulong)(local_348.field_2._M_allocated_capacity + 1))
    ;
  }
  GenOffsetType_abi_cxx11_(&local_258,this,struct_def);
  puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,0x36e44a);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  puVar13 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_300.field_2._M_allocated_capacity = *puVar13;
    local_300.field_2._8_8_ = puVar10[3];
  }
  else {
    local_300.field_2._M_allocated_capacity = *puVar13;
    local_300._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_300._M_string_length = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
  local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
  puVar13 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_2a0.name.field_2._M_allocated_capacity = *puVar13;
    local_2a0.name.field_2._8_8_ = puVar10[3];
  }
  else {
    local_2a0.name.field_2._M_allocated_capacity = *puVar13;
    local_2a0.name._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_2a0.name._M_string_length = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2a0.name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
    operator_delete(local_2a0.name._M_dataplus._M_p,
                    (ulong)(local_2a0.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,(ulong)(local_300.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  ppFVar18 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar18 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1a0 = &(local_178->_M_t)._M_impl.super__Rb_tree_header._M_header;
    do {
      pFVar4 = *ppFVar18;
      if (pFVar4->deprecated != false) goto LAB_001bec0f;
      Name_abi_cxx11_(&local_300,this,pFVar4);
      if ((local_300._M_string_length == (struct_def->super_Definition).name._M_string_length) &&
         ((local_300._M_string_length == 0 ||
          (iVar8 = bcmp(local_300._M_dataplus._M_p,
                        (struct_def->super_Definition).name._M_dataplus._M_p,
                        local_300._M_string_length), iVar8 == 0)))) {
        std::__cxx11::string::append((char *)&local_300);
      }
      Name_abi_cxx11_(&local_258,this,pFVar4);
      BVar3 = (pFVar4->value).type.base_type;
      if (4 < BVar3 - BASE_TYPE_STRING) goto LAB_001bebc5;
      pVVar1 = &pFVar4->value;
      switch(BVar3) {
      case BASE_TYPE_STRING:
        pcVar19 = "CreateString";
        if (pFVar4->shared != false) {
          pcVar19 = "CreateSharedString";
        }
        local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
        pcVar16 = pcVar19 + 0xc;
        if (pFVar4->shared != false) {
          pcVar16 = pcVar19 + 0x12;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,pcVar19,pcVar16);
        std::operator+(&local_218,"    var _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_218);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_238.field_2._M_allocated_capacity = *puVar13;
          local_238.field_2._8_8_ = puVar10[3];
        }
        else {
          local_238.field_2._M_allocated_capacity = *puVar13;
          local_238._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_238._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_238,(ulong)local_300._M_dataplus._M_p);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_278.field_2._M_allocated_capacity = *puVar13;
          local_278.field_2._8_8_ = puVar10[3];
        }
        else {
          local_278.field_2._M_allocated_capacity = *puVar13;
          local_278._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_278._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_2e0.field_2._M_allocated_capacity = *puVar13;
          local_2e0.field_2._8_8_ = puVar10[3];
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *puVar13;
          local_2e0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_2e0._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_2e0,(ulong)local_2a0.name._M_dataplus._M_p);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_328.field_2._M_allocated_capacity = *puVar13;
          local_328.field_2._8_8_ = puVar10[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar13;
          local_328._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_328._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_2c0.field_2._M_allocated_capacity = *puVar13;
          local_2c0.field_2._8_8_ = puVar10[3];
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *puVar13;
          local_2c0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_2c0._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_2c0,(ulong)local_300._M_dataplus._M_p);
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_348.field_2._M_allocated_capacity = *puVar13;
          local_348.field_2._8_8_ = puVar10[3];
        }
        else {
          local_348.field_2._M_allocated_capacity = *puVar13;
          local_348._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_348._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
        local_378._0_8_ = local_378 + 0x10;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_378._16_8_ = *puVar13;
          _uStack_360 = puVar10[3];
        }
        else {
          local_378._16_8_ = *puVar13;
          local_378._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar10;
        }
        local_378._8_8_ = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
        if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
          operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,
                          (ulong)(local_348.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,
                          (ulong)(local_2c0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,
                          (ulong)(local_328.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          (ulong)(local_278.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,
                          (ulong)(local_238.field_2._M_allocated_capacity + 1));
        }
        uVar20 = local_218.field_2._M_allocated_capacity;
        _Var21._M_p = local_218._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
LAB_001beb98:
          operator_delete(_Var21._M_p,
                          (ulong)((long)&(((EnumDef *)uVar20)->super_Definition).name._M_dataplus.
                                         _M_p + 1));
        }
        goto LAB_001beba0;
      case BASE_TYPE_VECTOR:
        p_Var11 = local_1a0;
        for (p_Var15 = (local_178->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var15 != (_Base_ptr)0x0;
            p_Var15 = (&p_Var15->_M_left)[*(FieldDef **)(p_Var15 + 1) < pFVar4]) {
          if (*(FieldDef **)(p_Var15 + 1) >= pFVar4) {
            p_Var11 = p_Var15;
          }
        }
        p_Var15 = local_1a0;
        if ((p_Var11 != local_1a0) && (p_Var15 = p_Var11, pFVar4 < *(FieldDef **)(p_Var11 + 1))) {
          p_Var15 = local_1a0;
        }
        if (p_Var15 == local_1a0) {
          local_1a8 = (pFVar4->value).type.struct_def;
          local_349 = local_1a8 == (StructDef *)0x0;
          if ((bool)local_349) {
            local_378._8_8_ = (pFVar4->value).type.struct_def;
            local_378._16_8_ = (pFVar4->value).type.enum_def;
            local_378._4_4_ = 0;
            local_378._0_4_ = (pFVar4->value).type.element;
            uStack_360 = (pFVar4->value).type.fixed_length;
            GenMethod_abi_cxx11_(&local_50,this,(Type *)local_378);
            plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x36dbee);
            local_f0 = &local_e0;
            plVar14 = plVar9 + 2;
            if ((long *)*plVar9 == plVar14) {
              local_e0 = *plVar14;
              lStack_d8 = plVar9[3];
            }
            else {
              local_e0 = *plVar14;
              local_f0 = (long *)*plVar9;
            }
            local_e8 = plVar9[1];
            *plVar9 = (long)plVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_f0);
            local_d0 = &local_c0;
            plVar14 = plVar9 + 2;
            if ((long *)*plVar9 == plVar14) {
              local_c0 = *plVar14;
              lStack_b8 = plVar9[3];
            }
            else {
              local_c0 = *plVar14;
              local_d0 = (long *)*plVar9;
            }
            local_c8 = plVar9[1];
            *plVar9 = (long)plVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_d0,(ulong)local_300._M_dataplus._M_p);
            local_b0 = &local_a0;
            plVar14 = plVar9 + 2;
            if ((long *)*plVar9 == plVar14) {
              local_a0 = *plVar14;
              lStack_98 = plVar9[3];
            }
            else {
              local_a0 = *plVar14;
              local_b0 = (long *)*plVar9;
            }
            local_a8 = plVar9[1];
            *plVar9 = (long)plVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
          }
          else {
            GenTypeGet_abi_cxx11_(&local_70,this,&pVVar1->type);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_130 = &local_120;
            plVar14 = plVar9 + 2;
            if ((long *)*plVar9 == plVar14) {
              local_120 = *plVar14;
              lStack_118 = plVar9[3];
            }
            else {
              local_120 = *plVar14;
              local_130 = (long *)*plVar9;
            }
            local_128 = plVar9[1];
            *plVar9 = (long)plVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_130,(ulong)local_300._M_dataplus._M_p);
            local_110 = &local_100;
            plVar14 = plVar9 + 2;
            if ((long *)*plVar9 == plVar14) {
              local_100 = *plVar14;
              lStack_f8 = plVar9[3];
            }
            else {
              local_100 = *plVar14;
              local_110 = (long *)*plVar9;
            }
            local_108 = plVar9[1];
            *plVar9 = (long)plVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
          }
          local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_2a0.name.field_2._M_allocated_capacity = *puVar13;
            local_2a0.name.field_2._8_8_ = puVar10[3];
          }
          else {
            local_2a0.name.field_2._M_allocated_capacity = *puVar13;
            local_2a0.name._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_2a0.name._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)puVar13 = 0;
          if (local_1a8 == (StructDef *)0x0) {
            if (local_b0 != &local_a0) {
              operator_delete(local_b0,local_a0 + 1);
            }
            if (local_d0 != &local_c0) {
              operator_delete(local_d0,local_c0 + 1);
            }
            if (local_f0 != &local_e0) {
              operator_delete(local_f0,local_e0 + 1);
            }
            uVar20 = local_50.field_2._M_allocated_capacity;
            _Var21._M_p = local_50._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_001bd2f4;
          }
          else {
            if (local_110 != &local_100) {
              operator_delete(local_110,local_100 + 1);
            }
            if (local_130 != &local_120) {
              operator_delete(local_130,local_120 + 1);
            }
            uVar20 = local_70.field_2._M_allocated_capacity;
            _Var21._M_p = local_70._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_001bd2f4:
              operator_delete(_Var21._M_p,uVar20 + 1);
            }
          }
          std::operator+(&local_348,"    var _",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4
                        );
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_348);
          local_378._0_8_ = local_378 + 0x10;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar12) {
            local_378._16_8_ = *psVar12;
            _uStack_360 = plVar9[3];
          }
          else {
            local_378._16_8_ = *psVar12;
            local_378._0_8_ = (size_type *)*plVar9;
          }
          local_378._8_8_ = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
          if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
            operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,
                            (ulong)(local_348.field_2._M_allocated_capacity + 1));
          }
          std::operator+(&local_348,"    if (_o.",&local_300);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_348);
          local_378._0_8_ = local_378 + 0x10;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar12) {
            local_378._16_8_ = *psVar12;
            _uStack_360 = plVar9[3];
          }
          else {
            local_378._16_8_ = *psVar12;
            local_378._0_8_ = (size_type *)*plVar9;
          }
          local_378._8_8_ = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
          if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
            operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,
                            (ulong)(local_348.field_2._M_allocated_capacity + 1));
          }
          std::operator+(&local_328,"      Start",&local_258);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_2c0.field_2._M_allocated_capacity = *psVar12;
            local_2c0.field_2._8_8_ = plVar9[3];
          }
          else {
            local_2c0.field_2._M_allocated_capacity = *psVar12;
            local_2c0._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_2c0._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_2c0,(ulong)local_300._M_dataplus._M_p);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_348.field_2._M_allocated_capacity = *psVar12;
            local_348.field_2._8_8_ = plVar9[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar12;
            local_348._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_348._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_348);
          local_378._0_8_ = local_378 + 0x10;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar12) {
            local_378._16_8_ = *psVar12;
            _uStack_360 = plVar9[3];
          }
          else {
            local_378._16_8_ = *psVar12;
            local_378._0_8_ = (size_type *)*plVar9;
          }
          local_378._8_8_ = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
          if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
            operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,
                            (ulong)(local_328.field_2._M_allocated_capacity + 1));
          }
          std::operator+(&local_328,"      for (var _j = _o.",&local_300);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_2c0.field_2._M_allocated_capacity = *puVar13;
            local_2c0.field_2._8_8_ = puVar10[3];
          }
          else {
            local_2c0.field_2._M_allocated_capacity = *puVar13;
            local_2c0._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_2c0._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_2c0,(ulong)local_2a0.name._M_dataplus._M_p);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_348.field_2._M_allocated_capacity = *puVar13;
            local_348.field_2._8_8_ = puVar10[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *puVar13;
            local_348._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_348._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_348);
          local_378._0_8_ = local_378 + 0x10;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar12) {
            local_378._16_8_ = *psVar12;
            _uStack_360 = plVar9[3];
          }
          else {
            local_378._16_8_ = *psVar12;
            local_378._0_8_ = (size_type *)*plVar9;
          }
          local_378._8_8_ = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
          if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
            operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,
                            (ulong)(local_348.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,
                            (ulong)(local_2c0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,
                            (ulong)(local_328.field_2._M_allocated_capacity + 1));
          }
          std::operator+(&local_348,"      _",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4
                        );
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
          local_378._0_8_ = local_378 + 0x10;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_378._16_8_ = *puVar13;
            _uStack_360 = puVar10[3];
          }
          else {
            local_378._16_8_ = *puVar13;
            local_378._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar10;
          }
          local_378._8_8_ = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_308,local_378._0_8_);
          if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
            operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,
                            (ulong)(local_348.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::string::append((char *)local_308);
          goto LAB_001beba0;
        }
        local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a0,local_300._M_dataplus._M_p,
                   local_300._M_dataplus._M_p + local_300._M_string_length);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_378,"__",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4);
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"","");
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"","");
        BVar3 = (pFVar4->value).type.element;
        bVar7 = false;
        if ((int)BVar3 < 0xf) {
          if (BVar3 == BASE_TYPE_UTYPE) {
            std::__cxx11::string::substr((ulong)&local_328,(ulong)&local_300);
            std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_328);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              operator_delete(local_328._M_dataplus._M_p,
                              (ulong)(local_328.field_2._M_allocated_capacity + 1));
            }
            NamespacedName_abi_cxx11_
                      (&local_328,this,&((pFVar4->value).type.enum_def)->super_Definition);
            std::__cxx11::string::operator=((string *)&local_348,(string *)&local_328);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              operator_delete(local_328._M_dataplus._M_p,
                              (ulong)(local_328.field_2._M_allocated_capacity + 1));
            }
            std::operator+(&local_2e0,"_o.",&local_2a0.name);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_328.field_2._M_allocated_capacity = *puVar13;
              local_328.field_2._8_8_ = puVar10[3];
              local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            }
            else {
              local_328.field_2._M_allocated_capacity = *puVar13;
              local_328._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_328._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_328);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              operator_delete(local_328._M_dataplus._M_p,
                              (ulong)(local_328.field_2._M_allocated_capacity + 1));
            }
            uVar20 = local_2e0.field_2._M_allocated_capacity;
            _Var21._M_p = local_2e0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) goto LAB_001bded7;
            goto LAB_001bdedf;
          }
          bVar7 = false;
          if (BVar3 == BASE_TYPE_STRING) {
            pcVar19 = "CreateString";
            if (pFVar4->shared != false) {
              pcVar19 = "CreateSharedString";
            }
            local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            pcVar16 = pcVar19 + 0xc;
            if (pFVar4->shared != false) {
              pcVar16 = pcVar19 + 0x12;
            }
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,pcVar19,pcVar16);
            std::__cxx11::string::_M_replace
                      ((ulong)&local_348,0,(char *)local_348._M_string_length,0x36c97d);
            std::operator+(&local_218,"builder.",&local_328);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_218);
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_238.field_2._M_allocated_capacity = *puVar13;
              local_238.field_2._8_8_ = puVar10[3];
            }
            else {
              local_238.field_2._M_allocated_capacity = *puVar13;
              local_238._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_238._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_238,(ulong)local_2a0.name._M_dataplus._M_p);
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_278.field_2._M_allocated_capacity = *puVar13;
              local_278.field_2._8_8_ = puVar10[3];
            }
            else {
              local_278.field_2._M_allocated_capacity = *puVar13;
              local_278._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_278._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_2e0.field_2._M_allocated_capacity = *puVar13;
              local_2e0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_2e0.field_2._M_allocated_capacity = *puVar13;
              local_2e0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_2e0._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_2e0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,
                              (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,
                              (ulong)(local_278.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,
                              (ulong)(local_238.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,
                              (ulong)(local_218.field_2._M_allocated_capacity + 1));
            }
            uVar20 = local_328.field_2._M_allocated_capacity;
            _Var21._M_p = local_328._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) goto LAB_001bded7;
            goto LAB_001bdedf;
          }
        }
        else {
          if (BVar3 == BASE_TYPE_STRUCT) {
            GenTypeGet_abi_cxx11_(&local_278,this,&pVVar1->type);
            plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x36df12)
            ;
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_2e0.field_2._M_allocated_capacity = *psVar12;
              local_2e0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_2e0.field_2._M_allocated_capacity = *psVar12;
              local_2e0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_2e0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_2e0);
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_328.field_2._M_allocated_capacity = *psVar12;
              local_328.field_2._8_8_ = plVar9[3];
              local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            }
            else {
              local_328.field_2._M_allocated_capacity = *psVar12;
              local_328._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_328._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_348,(string *)&local_328);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,
                              (ulong)(local_278.field_2._M_allocated_capacity + 1));
            }
            GenTypeGet_abi_cxx11_(&local_238,this,&pVVar1->type);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_278.field_2._M_allocated_capacity = *puVar13;
              local_278.field_2._8_8_ = puVar10[3];
            }
            else {
              local_278.field_2._M_allocated_capacity = *puVar13;
              local_278._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_278._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_278,(ulong)local_2a0.name._M_dataplus._M_p);
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_2e0.field_2._M_allocated_capacity = *puVar13;
              local_2e0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_2e0.field_2._M_allocated_capacity = *puVar13;
              local_2e0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_2e0._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
          }
          else {
            if (BVar3 != BASE_TYPE_UNION) goto LAB_001bdee1;
            std::__cxx11::string::_M_replace
                      ((ulong)&local_348,0,(char *)local_348._M_string_length,0x368916);
            NamespacedName_abi_cxx11_
                      (&local_238,this,&((pFVar4->value).type.enum_def)->super_Definition);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_278.field_2._M_allocated_capacity = *puVar13;
              local_278.field_2._8_8_ = puVar10[3];
            }
            else {
              local_278.field_2._M_allocated_capacity = *puVar13;
              local_278._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_278._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_278,(ulong)local_2a0.name._M_dataplus._M_p);
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_2e0.field_2._M_allocated_capacity = *puVar13;
              local_2e0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_2e0.field_2._M_allocated_capacity = *puVar13;
              local_2e0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_2e0._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
          }
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_328.field_2._M_allocated_capacity = *puVar13;
            local_328.field_2._8_8_ = puVar10[3];
            local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          }
          else {
            local_328.field_2._M_allocated_capacity = *puVar13;
            local_328._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_328._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_328);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,
                            (ulong)(local_328.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,
                            (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,
                            (ulong)(local_278.field_2._M_allocated_capacity + 1));
          }
          uVar20 = local_238.field_2._M_allocated_capacity;
          _Var21._M_p = local_238._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
LAB_001bded7:
            operator_delete(_Var21._M_p,
                            (ulong)((long)&(((EnumDef *)uVar20)->super_Definition).name._M_dataplus.
                                           _M_p + 1));
          }
LAB_001bdedf:
          bVar7 = true;
        }
LAB_001bdee1:
        std::operator+(&local_2e0,"    var _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_2e0);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_328.field_2._M_allocated_capacity = *psVar12;
          local_328.field_2._8_8_ = plVar9[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *psVar12;
          local_328._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_328._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_308,(ulong)local_328._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
        }
        std::operator+(&local_2e0,"    if (_o.",&local_2a0.name);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_2e0);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_328.field_2._M_allocated_capacity = *psVar12;
          local_328.field_2._8_8_ = plVar9[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *psVar12;
          local_328._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_328._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_308,(ulong)local_328._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
        }
        if (bVar7) {
          std::operator+(&local_1f8,"      var ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_378);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f8);
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_218.field_2._M_allocated_capacity = *puVar13;
            local_218.field_2._8_8_ = puVar10[3];
          }
          else {
            local_218.field_2._M_allocated_capacity = *puVar13;
            local_218._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_218._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_218,(ulong)local_348._M_dataplus._M_p);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_238.field_2._M_allocated_capacity = *puVar13;
            local_238.field_2._8_8_ = puVar10[3];
          }
          else {
            local_238.field_2._M_allocated_capacity = *puVar13;
            local_238._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_238._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_278.field_2._M_allocated_capacity = *puVar13;
            local_278.field_2._8_8_ = puVar10[3];
          }
          else {
            local_278.field_2._M_allocated_capacity = *puVar13;
            local_278._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_278._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_278,(ulong)local_2a0.name._M_dataplus._M_p);
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_2e0.field_2._M_allocated_capacity = *psVar12;
            local_2e0.field_2._8_8_ = plVar9[3];
          }
          else {
            local_2e0.field_2._M_allocated_capacity = *psVar12;
            local_2e0._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_2e0._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_2e0);
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_328.field_2._M_allocated_capacity = *psVar12;
            local_328.field_2._8_8_ = plVar9[3];
          }
          else {
            local_328.field_2._M_allocated_capacity = *psVar12;
            local_328._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_328._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_308,(ulong)local_328._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,
                            (ulong)(local_278.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,
                            (ulong)(local_238.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,
                            (ulong)(local_218.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,
                            (ulong)(local_1f8.field_2._M_allocated_capacity + 1));
          }
          std::operator+(&local_2e0,"      for (var _j = 0; _j < ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_378);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_2e0);
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_328.field_2._M_allocated_capacity = *psVar12;
            local_328.field_2._8_8_ = plVar9[3];
          }
          else {
            local_328.field_2._M_allocated_capacity = *psVar12;
            local_328._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_328._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_308,(ulong)local_328._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,local_378._0_8_,
                     (char *)(local_378._0_8_ + (long)(Definition *)local_378._8_8_));
          std::__cxx11::string::append((char *)&local_278);
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_278,(ulong)local_2c0._M_dataplus._M_p);
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_2e0.field_2._M_allocated_capacity = *psVar12;
            local_2e0.field_2._8_8_ = plVar9[3];
          }
          else {
            local_2e0.field_2._M_allocated_capacity = *psVar12;
            local_2e0._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_2e0._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_2e0);
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_328.field_2._M_allocated_capacity = *psVar12;
            local_328.field_2._8_8_ = plVar9[3];
          }
          else {
            local_328.field_2._M_allocated_capacity = *psVar12;
            local_328._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_328._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_308,(ulong)local_328._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          uVar20 = local_278.field_2._M_allocated_capacity;
          _Var21._M_p = local_278._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
LAB_001be810:
            operator_delete(_Var21._M_p,
                            (ulong)((long)&(((EnumDef *)uVar20)->super_Definition).name._M_dataplus.
                                           _M_p + 1));
          }
        }
        else {
          std::operator+(&local_238,"      var ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_378);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_278.field_2._M_allocated_capacity = *puVar13;
            local_278.field_2._8_8_ = puVar10[3];
          }
          else {
            local_278.field_2._M_allocated_capacity = *puVar13;
            local_278._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_278._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_278,(ulong)local_2a0.name._M_dataplus._M_p);
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_2e0.field_2._M_allocated_capacity = *psVar12;
            local_2e0.field_2._8_8_ = plVar9[3];
          }
          else {
            local_2e0.field_2._M_allocated_capacity = *psVar12;
            local_2e0._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_2e0._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_2e0);
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_328.field_2._M_allocated_capacity = *psVar12;
            local_328.field_2._8_8_ = plVar9[3];
          }
          else {
            local_328.field_2._M_allocated_capacity = *psVar12;
            local_328._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_328._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_308,(ulong)local_328._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,
                            (ulong)(local_278.field_2._M_allocated_capacity + 1));
          }
          uVar20 = local_238.field_2._M_allocated_capacity;
          _Var21._M_p = local_238._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) goto LAB_001be810;
        }
        std::operator+(&local_1f8,"      _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f8);
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_218.field_2._M_allocated_capacity = *puVar13;
          local_218.field_2._8_8_ = puVar10[3];
        }
        else {
          local_218.field_2._M_allocated_capacity = *puVar13;
          local_218._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_218._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_218,(ulong)local_258._M_dataplus._M_p);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_238.field_2._M_allocated_capacity = *puVar13;
          local_238.field_2._8_8_ = puVar10[3];
        }
        else {
          local_238.field_2._M_allocated_capacity = *puVar13;
          local_238._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_238._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_278.field_2._M_allocated_capacity = *puVar13;
          local_278.field_2._8_8_ = puVar10[3];
        }
        else {
          local_278.field_2._M_allocated_capacity = *puVar13;
          local_278._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_278._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,local_378._0_8_);
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_2e0.field_2._M_allocated_capacity = *puVar13;
          local_2e0.field_2._8_8_ = puVar10[3];
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *puVar13;
          local_2e0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_2e0._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_328.field_2._M_allocated_capacity = *puVar13;
          local_328.field_2._8_8_ = puVar10[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar13;
          local_328._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_328._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_308,(ulong)local_328._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,
                          (ulong)(local_328.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          (ulong)(local_278.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,
                          (ulong)(local_238.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,
                          (ulong)(local_218.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,
                          (ulong)(local_1f8.field_2._M_allocated_capacity + 1));
        }
        std::__cxx11::string::append((char *)local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,
                          (ulong)(local_2c0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,
                          (ulong)(local_348.field_2._M_allocated_capacity + 1));
        }
        uVar20 = local_378._16_8_;
        _Var21._M_p = (pointer)local_378._0_8_;
        if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) goto LAB_001beb98;
LAB_001beba0:
        uVar20 = local_2a0.name.field_2._M_allocated_capacity;
        _Var21._M_p = local_2a0.name._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
LAB_001bebbd:
          operator_delete(_Var21._M_p,
                          (ulong)((long)&(((EnumDef *)uVar20)->super_Definition).name._M_dataplus.
                                         _M_p + 1));
        }
        break;
      case BASE_TYPE_STRUCT:
        if (((pFVar4->value).type.struct_def)->fixed != false) {
          if ((struct_def->fixed & (byte)local_1cc) == 1) {
            local_378._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_378._8_8_ = (StructDef *)0x0;
            local_378._16_8_ = (EnumDef *)0x0;
            local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
            pcVar6 = (pFVar4->super_Definition).name._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2a0,pcVar6,
                       pcVar6 + (pFVar4->super_Definition).name._M_string_length);
            local_2a0.length = (int)(pFVar4->value).type.fixed_length;
            std::
            vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
            ::push_back((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                         *)local_378,&local_2a0);
            GenStructPackDecl_ObjectAPI
                      (this,(pFVar4->value).type.struct_def,local_308,
                       (vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                        *)local_378);
            goto LAB_001bb487;
          }
          break;
        }
        std::operator+(&local_1f8,"    var _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f8);
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_218.field_2._M_allocated_capacity = *puVar13;
          local_218.field_2._8_8_ = puVar10[3];
        }
        else {
          local_218.field_2._M_allocated_capacity = *puVar13;
          local_218._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_218._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_218,(ulong)local_300._M_dataplus._M_p);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_238.field_2._M_allocated_capacity = *puVar13;
          local_238.field_2._8_8_ = puVar10[3];
        }
        else {
          local_238.field_2._M_allocated_capacity = *puVar13;
          local_238._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_238._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_278.field_2._M_allocated_capacity = *puVar13;
          local_278.field_2._8_8_ = puVar10[3];
        }
        else {
          local_278.field_2._M_allocated_capacity = *puVar13;
          local_278._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_278._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        GenOffsetType_abi_cxx11_(&local_1c8,this,(pFVar4->value).type.struct_def);
        uVar20 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          uVar20 = local_278.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar20 < (EnumDef *)(local_1c8._M_string_length + local_278._M_string_length)) {
          uVar20 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            uVar20 = local_1c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar20 < (EnumDef *)(local_1c8._M_string_length + local_278._M_string_length))
          goto LAB_001bc7a4;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_1c8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
        }
        else {
LAB_001bc7a4:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_278,(ulong)local_1c8._M_dataplus._M_p);
        }
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_2e0.field_2._M_allocated_capacity = *puVar13;
          local_2e0.field_2._8_8_ = puVar10[3];
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *puVar13;
          local_2e0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_2e0._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_328.field_2._M_allocated_capacity = *puVar13;
          local_328.field_2._8_8_ = puVar10[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar13;
          local_328._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_328._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        GenTypeGet_abi_cxx11_(&local_198,this,&pVVar1->type);
        uVar20 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          uVar20 = local_328.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar20 < (EnumDef *)(local_198._M_string_length + local_328._M_string_length)) {
          uVar20 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            uVar20 = local_198.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar20 < (EnumDef *)(local_198._M_string_length + local_328._M_string_length))
          goto LAB_001bcc79;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_198,0,(char *)0x0,(ulong)local_328._M_dataplus._M_p);
        }
        else {
LAB_001bcc79:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_328,(ulong)local_198._M_dataplus._M_p);
        }
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_2c0.field_2._M_allocated_capacity = *puVar13;
          local_2c0.field_2._8_8_ = puVar10[3];
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *puVar13;
          local_2c0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_2c0._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c0);
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_348.field_2._M_allocated_capacity = *puVar13;
          local_348.field_2._8_8_ = puVar10[3];
        }
        else {
          local_348.field_2._M_allocated_capacity = *puVar13;
          local_348._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_348._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_348,(ulong)local_300._M_dataplus._M_p);
        local_378._0_8_ = local_378 + 0x10;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_378._16_8_ = *puVar13;
          _uStack_360 = puVar10[3];
        }
        else {
          local_378._16_8_ = *puVar13;
          local_378._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar10;
        }
        local_378._8_8_ = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append(local_378);
        local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_2a0.name.field_2._M_allocated_capacity = *puVar13;
          local_2a0.name.field_2._8_8_ = puVar10[3];
        }
        else {
          local_2a0.name.field_2._M_allocated_capacity = *puVar13;
          local_2a0.name._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_2a0.name._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2a0.name._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
          operator_delete(local_2a0.name._M_dataplus._M_p,
                          (ulong)(local_2a0.name.field_2._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
          operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,
                          (ulong)(local_348.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,
                          (ulong)(local_2c0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,
                          (ulong)(local_198.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,
                          (ulong)(local_328.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,
                          (ulong)(local_1c8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          (ulong)(local_278.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,
                          (ulong)(local_238.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,
                          (ulong)(local_218.field_2._M_allocated_capacity + 1));
        }
        uVar20 = local_1f8.field_2._M_allocated_capacity;
        _Var21._M_p = local_1f8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p == &local_1f8.field_2) break;
        goto LAB_001bebbd;
      case BASE_TYPE_UNION:
        std::operator+(&local_218,"    var _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_218);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_238.field_2._M_allocated_capacity = *puVar13;
          local_238.field_2._8_8_ = puVar10[3];
        }
        else {
          local_238.field_2._M_allocated_capacity = *puVar13;
          local_238._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_238._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_238,(ulong)local_300._M_dataplus._M_p);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_278.field_2._M_allocated_capacity = *psVar12;
          local_278.field_2._8_8_ = plVar9[3];
        }
        else {
          local_278.field_2._M_allocated_capacity = *psVar12;
          local_278._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_278._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_2e0.field_2._M_allocated_capacity = *puVar13;
          local_2e0.field_2._8_8_ = puVar10[3];
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *puVar13;
          local_2e0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_2e0._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        NamespacedName_abi_cxx11_
                  (&local_1f8,this,&((pFVar4->value).type.enum_def)->super_Definition);
        uVar20 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          uVar20 = local_2e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar20 < (EnumDef *)(local_1f8._M_string_length + local_2e0._M_string_length)) {
          uVar20 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            uVar20 = local_1f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar20 < (EnumDef *)(local_1f8._M_string_length + local_2e0._M_string_length))
          goto LAB_001bba1b;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_2e0._M_dataplus._M_p);
        }
        else {
LAB_001bba1b:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_2e0,(ulong)local_1f8._M_dataplus._M_p);
        }
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        psVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_328.field_2._M_allocated_capacity = *psVar12;
          local_328.field_2._8_8_ = puVar10[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *psVar12;
          local_328._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_328._M_string_length = puVar10[1];
        *puVar10 = psVar12;
        puVar10[1] = 0;
        *(undefined1 *)psVar12 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_328);
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_2c0.field_2._M_allocated_capacity = *psVar12;
          local_2c0.field_2._8_8_ = plVar9[3];
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *psVar12;
          local_2c0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_2c0._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_2c0);
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_348.field_2._M_allocated_capacity = *psVar12;
          local_348.field_2._8_8_ = plVar9[3];
        }
        else {
          local_348.field_2._M_allocated_capacity = *psVar12;
          local_348._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_348._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_348,(ulong)local_300._M_dataplus._M_p);
        local_378._0_8_ = local_378 + 0x10;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar12) {
          local_378._16_8_ = *psVar12;
          _uStack_360 = plVar9[3];
        }
        else {
          local_378._16_8_ = *psVar12;
          local_378._0_8_ = (size_type *)*plVar9;
        }
        local_378._8_8_ = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append(local_378);
        local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_2a0.name.field_2._M_allocated_capacity = *psVar12;
          local_2a0.name.field_2._8_8_ = plVar9[3];
        }
        else {
          local_2a0.name.field_2._M_allocated_capacity = *psVar12;
          local_2a0.name._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_2a0.name._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2a0.name._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
          operator_delete(local_2a0.name._M_dataplus._M_p,
                          local_2a0.name.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
          operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,
                          (ulong)(local_1f8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,
                          (ulong)(local_238.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,
                          (ulong)(local_218.field_2._M_allocated_capacity + 1));
        }
        std::operator+(&local_238,"    var _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_278.field_2._M_allocated_capacity = *puVar13;
          local_278.field_2._8_8_ = puVar10[3];
        }
        else {
          local_278.field_2._M_allocated_capacity = *puVar13;
          local_278._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_278._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_278,(ulong)local_300._M_dataplus._M_p);
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_2e0.field_2._M_allocated_capacity = *puVar13;
          local_2e0.field_2._8_8_ = puVar10[3];
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *puVar13;
          local_2e0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_2e0._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_328.field_2._M_allocated_capacity = *puVar13;
          local_328.field_2._8_8_ = puVar10[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar13;
          local_328._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_328._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        GenTypeGet_ObjectAPI_abi_cxx11_(&local_218,this,pVVar1->type,local_1d8);
        uVar20 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          uVar20 = local_328.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar20 < (EnumDef *)(local_218._M_string_length + local_328._M_string_length)) {
          uVar20 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            uVar20 = local_218.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar20 < (EnumDef *)(local_218._M_string_length + local_328._M_string_length))
          goto LAB_001bc33b;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_218,0,(char *)0x0,(ulong)local_328._M_dataplus._M_p);
        }
        else {
LAB_001bc33b:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_328,(ulong)local_218._M_dataplus._M_p);
        }
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_2c0.field_2._M_allocated_capacity = *puVar13;
          local_2c0.field_2._8_8_ = puVar10[3];
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *puVar13;
          local_2c0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_2c0._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c0);
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_348.field_2._M_allocated_capacity = *puVar13;
          local_348.field_2._8_8_ = puVar10[3];
        }
        else {
          local_348.field_2._M_allocated_capacity = *puVar13;
          local_348._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_348._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_348,(ulong)local_300._M_dataplus._M_p);
        local_378._0_8_ = local_378 + 0x10;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_378._16_8_ = *puVar13;
          _uStack_360 = puVar10[3];
        }
        else {
          local_378._16_8_ = *puVar13;
          local_378._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar10;
        }
        local_378._8_8_ = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append(local_378);
        local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_2a0.name.field_2._M_allocated_capacity = *puVar13;
          local_2a0.name.field_2._8_8_ = puVar10[3];
        }
        else {
          local_2a0.name.field_2._M_allocated_capacity = *puVar13;
          local_2a0.name._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_2a0.name._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2a0.name._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
          operator_delete(local_2a0.name._M_dataplus._M_p,
                          (ulong)(local_2a0.name.field_2._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
          operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,
                          (ulong)(local_348.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,
                          (ulong)(local_2c0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,
                          (ulong)(local_218.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,
                          (ulong)(local_328.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          (ulong)(local_278.field_2._M_allocated_capacity + 1));
        }
        uVar20 = local_238.field_2._M_allocated_capacity;
        _Var21._M_p = local_238._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) goto LAB_001bebbd;
        break;
      case BASE_TYPE_ARRAY:
        if ((pFVar4->value).type.struct_def == (StructDef *)0x0) {
          std::operator+(&local_2c0,"    var _",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4
                        );
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c0);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_348.field_2._M_allocated_capacity = *puVar13;
            local_348.field_2._8_8_ = puVar10[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *puVar13;
            local_348._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_348._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_348,(ulong)local_300._M_dataplus._M_p);
          local_378._0_8_ = local_378 + 0x10;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_378._16_8_ = *puVar13;
            _uStack_360 = puVar10[3];
          }
          else {
            local_378._16_8_ = *puVar13;
            local_378._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar10;
          }
          local_378._8_8_ = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append(local_378);
          local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
          puVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_2a0.name.field_2._M_allocated_capacity = *puVar13;
            local_2a0.name.field_2._8_8_ = puVar10[3];
          }
          else {
            local_2a0.name.field_2._M_allocated_capacity = *puVar13;
            local_2a0.name._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_2a0.name._M_string_length = puVar10[1];
          *puVar10 = puVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2a0.name._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
            operator_delete(local_2a0.name._M_dataplus._M_p,
                            (ulong)(local_2a0.name.field_2._M_allocated_capacity + 1));
          }
          if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
            operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,
                            (ulong)(local_348.field_2._M_allocated_capacity + 1));
          }
          uVar20 = local_2c0.field_2._M_allocated_capacity;
          _Var21._M_p = local_2c0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) goto LAB_001bebbd;
        }
        else {
          local_378._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_378._8_8_ = (StructDef *)0x0;
          local_378._16_8_ = (EnumDef *)0x0;
          local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
          pcVar6 = (pFVar4->super_Definition).name._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2a0,pcVar6,
                     pcVar6 + (pFVar4->super_Definition).name._M_string_length);
          local_2a0.length = (int)(pFVar4->value).type.fixed_length;
          std::
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ::push_back((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                       *)local_378,&local_2a0);
          GenStructPackDecl_ObjectAPI
                    (this,(pFVar4->value).type.struct_def,local_308,
                     (vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                      *)local_378);
LAB_001bb487:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
            operator_delete(local_2a0.name._M_dataplus._M_p,
                            (ulong)(local_2a0.name.field_2._M_allocated_capacity + 1));
          }
          std::
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ::~vector((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                     *)local_378);
        }
      }
LAB_001bebc5:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        (ulong)(local_300.field_2._M_allocated_capacity + 1));
      }
LAB_001bec0f:
      ppFVar18 = ppFVar18 + 1;
    } while (ppFVar18 !=
             (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if ((byte)local_1cc == '\0') {
    std::operator+(&local_300,"    Start",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_300);
    local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_2a0.name.field_2._M_allocated_capacity = *psVar12;
      local_2a0.name.field_2._8_8_ = plVar9[3];
    }
    else {
      local_2a0.name.field_2._M_allocated_capacity = *psVar12;
      local_2a0.name._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2a0.name._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2a0.name._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
      operator_delete(local_2a0.name._M_dataplus._M_p,
                      local_2a0.name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,
                      (ulong)(local_300.field_2._M_allocated_capacity + 1));
    }
    ppFVar18 = (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppFVar18 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        pFVar4 = *ppFVar18;
        if (pFVar4->deprecated == false) {
          Name_abi_cxx11_(&local_2a0.name,this,pFVar4);
          BVar3 = (pFVar4->value).type.base_type;
          switch(BVar3) {
          case BASE_TYPE_STRING:
          case BASE_TYPE_VECTOR:
          case BASE_TYPE_ARRAY:
            std::operator+(&local_348,"    Add",&local_2a0.name);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
            local_378._0_8_ = local_378 + 0x10;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_378._16_8_ = *puVar13;
              _uStack_360 = puVar10[3];
            }
            else {
              local_378._16_8_ = *puVar13;
              local_378._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar10;
            }
            local_378._8_8_ = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       (local_378,
                                        (ulong)(pFVar4->super_Definition).name._M_dataplus._M_p);
            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_258.field_2._M_allocated_capacity = *psVar12;
              local_258.field_2._8_8_ = plVar9[3];
            }
            else {
              local_258.field_2._M_allocated_capacity = *psVar12;
              local_258._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_258._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
            local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_300.field_2._M_allocated_capacity = *puVar13;
              local_300.field_2._8_8_ = puVar10[3];
            }
            else {
              local_300.field_2._M_allocated_capacity = *puVar13;
              local_300._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_300._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_308,(ulong)local_300._M_dataplus._M_p);
            break;
          case BASE_TYPE_STRUCT:
            if (((pFVar4->value).type.struct_def)->fixed != true) {
              std::operator+(&local_348,"    Add",&local_2a0.name);
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
              local_378._0_8_ = local_378 + 0x10;
              puVar13 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar13) {
                local_378._16_8_ = *puVar13;
                _uStack_360 = puVar10[3];
              }
              else {
                local_378._16_8_ = *puVar13;
                local_378._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar10;
              }
              local_378._8_8_ = puVar10[1];
              *puVar10 = puVar13;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  (local_378,(ulong)(pFVar4->super_Definition).name._M_dataplus._M_p
                                  );
              local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
              psVar12 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_258.field_2._M_allocated_capacity = *psVar12;
                local_258.field_2._8_8_ = puVar10[3];
              }
              else {
                local_258.field_2._M_allocated_capacity = *psVar12;
                local_258._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_258._M_string_length = puVar10[1];
              *puVar10 = psVar12;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
              local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
              puVar13 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar13) {
                local_300.field_2._M_allocated_capacity = *puVar13;
                local_300.field_2._8_8_ = puVar10[3];
              }
              else {
                local_300.field_2._M_allocated_capacity = *puVar13;
                local_300._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_300._M_string_length = puVar10[1];
              *puVar10 = puVar13;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_308,(ulong)local_300._M_dataplus._M_p);
              break;
            }
            std::operator+(&local_328,"    Add",&local_2a0.name);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
            local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_2c0.field_2._M_allocated_capacity = *puVar13;
              local_2c0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_2c0.field_2._M_allocated_capacity = *puVar13;
              local_2c0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_2c0._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            GenTypeGet_abi_cxx11_(&local_2e0,this,&(pFVar4->value).type);
            uVar20 = (EnumDef *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
              uVar20 = local_2c0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar20 < (EnumDef *)(local_2e0._M_string_length + local_2c0._M_string_length)
               ) {
              uVar20 = (EnumDef *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                uVar20 = local_2e0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar20 <
                  (EnumDef *)(local_2e0._M_string_length + local_2c0._M_string_length))
              goto LAB_001bfcbd;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_2e0,0,(char *)0x0,(ulong)local_2c0._M_dataplus._M_p
                                  );
            }
            else {
LAB_001bfcbd:
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_2c0,(ulong)local_2e0._M_dataplus._M_p);
            }
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_348.field_2._M_allocated_capacity = *puVar13;
              local_348.field_2._8_8_ = puVar10[3];
            }
            else {
              local_348.field_2._M_allocated_capacity = *puVar13;
              local_348._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_348._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)puVar13 = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
            local_378._0_8_ = local_378 + 0x10;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_378._16_8_ = *puVar13;
              _uStack_360 = puVar10[3];
            }
            else {
              local_378._16_8_ = *puVar13;
              local_378._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar10;
            }
            local_378._8_8_ = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                (local_378,(ulong)local_2a0.name._M_dataplus._M_p);
            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_258.field_2._M_allocated_capacity = *psVar12;
              local_258.field_2._8_8_ = puVar10[3];
            }
            else {
              local_258.field_2._M_allocated_capacity = *psVar12;
              local_258._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_258._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
            local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_300.field_2._M_allocated_capacity = *puVar13;
              local_300.field_2._8_8_ = puVar10[3];
            }
            else {
              local_300.field_2._M_allocated_capacity = *puVar13;
              local_300._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_300._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_308,(ulong)local_300._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_300._M_dataplus._M_p != &local_300.field_2) {
              operator_delete(local_300._M_dataplus._M_p,
                              (ulong)(local_300.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
              operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,
                              (ulong)(local_348.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,
                              (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
              operator_delete(local_2c0._M_dataplus._M_p,
                              (ulong)(local_2c0.field_2._M_allocated_capacity + 1));
            }
            uVar20 = local_328.field_2._M_allocated_capacity;
            _Var21._M_p = local_328._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p == &local_328.field_2) goto LAB_001bfe64;
            goto LAB_001bfe5c;
          case BASE_TYPE_UNION:
            std::operator+(&local_348,"    Add",&local_2a0.name);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_348);
            local_378._0_8_ = local_378 + 0x10;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((size_type *)*plVar9 == psVar12) {
              local_378._16_8_ = *psVar12;
              _uStack_360 = plVar9[3];
            }
            else {
              local_378._16_8_ = *psVar12;
              local_378._0_8_ = (size_type *)*plVar9;
            }
            local_378._8_8_ = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       (local_378,
                                        (ulong)(pFVar4->super_Definition).name._M_dataplus._M_p);
            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_258.field_2._M_allocated_capacity = *psVar12;
              local_258.field_2._8_8_ = plVar9[3];
            }
            else {
              local_258.field_2._M_allocated_capacity = *psVar12;
              local_258._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_258._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_258);
            local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_300.field_2._M_allocated_capacity = *psVar12;
              local_300.field_2._8_8_ = plVar9[3];
            }
            else {
              local_300.field_2._M_allocated_capacity = *psVar12;
              local_300._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_300._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_308,(ulong)local_300._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_300._M_dataplus._M_p != &local_300.field_2) {
              operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
              operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,
                              (ulong)(local_348.field_2._M_allocated_capacity + 1));
            }
            std::operator+(&local_348,"    Add",&local_2a0.name);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
            local_378._0_8_ = local_378 + 0x10;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_378._16_8_ = *puVar13;
              _uStack_360 = puVar10[3];
            }
            else {
              local_378._16_8_ = *puVar13;
              local_378._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar10;
            }
            local_378._8_8_ = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                (local_378,(ulong)(pFVar4->super_Definition).name._M_dataplus._M_p);
            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_258.field_2._M_allocated_capacity = *psVar12;
              local_258.field_2._8_8_ = puVar10[3];
            }
            else {
              local_258.field_2._M_allocated_capacity = *psVar12;
              local_258._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_258._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
            local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_300.field_2._M_allocated_capacity = *puVar13;
              local_300.field_2._8_8_ = puVar10[3];
            }
            else {
              local_300.field_2._M_allocated_capacity = *puVar13;
              local_300._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_300._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_308,(ulong)local_300._M_dataplus._M_p);
            break;
          default:
            if (BVar3 != BASE_TYPE_UTYPE) {
              std::operator+(&local_348,"    Add",&local_2a0.name);
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
              local_378._0_8_ = local_378 + 0x10;
              puVar13 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar13) {
                local_378._16_8_ = *puVar13;
                _uStack_360 = puVar10[3];
              }
              else {
                local_378._16_8_ = *puVar13;
                local_378._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar10;
              }
              local_378._8_8_ = puVar10[1];
              *puVar10 = puVar13;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  (local_378,(ulong)local_2a0.name._M_dataplus._M_p);
              local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
              psVar12 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_258.field_2._M_allocated_capacity = *psVar12;
                local_258.field_2._8_8_ = puVar10[3];
              }
              else {
                local_258.field_2._M_allocated_capacity = *psVar12;
                local_258._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_258._M_string_length = puVar10[1];
              *puVar10 = psVar12;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
              local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
              puVar13 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar13) {
                local_300.field_2._M_allocated_capacity = *puVar13;
                local_300.field_2._8_8_ = puVar10[3];
              }
              else {
                local_300.field_2._M_allocated_capacity = *puVar13;
                local_300._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_300._M_string_length = puVar10[1];
              *puVar10 = puVar13;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_308,(ulong)local_300._M_dataplus._M_p);
              break;
            }
            goto LAB_001bfe64;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p,
                            (ulong)(local_300.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
            operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
          }
          uVar20 = local_348.field_2._M_allocated_capacity;
          _Var21._M_p = local_348._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
LAB_001bfe5c:
            operator_delete(_Var21._M_p,
                            (ulong)((long)&(((EnumDef *)uVar20)->super_Definition).name._M_dataplus.
                                           _M_p + 1));
          }
LAB_001bfe64:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
            operator_delete(local_2a0.name._M_dataplus._M_p,
                            local_2a0.name.field_2._M_allocated_capacity + 1);
          }
        }
        ppFVar18 = ppFVar18 + 1;
      } while (ppFVar18 !=
               (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::operator+(&local_300,"    return End",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_300);
    paVar2 = &local_2a0.name.field_2;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_2a0.name.field_2._M_allocated_capacity = *psVar12;
      local_2a0.name.field_2._8_8_ = plVar9[3];
      local_2a0.name._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_2a0.name.field_2._M_allocated_capacity = *psVar12;
      local_2a0.name._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2a0.name._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2a0.name._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0.name._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a0.name._M_dataplus._M_p,
                      local_2a0.name.field_2._M_allocated_capacity + 1);
    }
    psVar17 = local_308;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,
                      (ulong)(local_300.field_2._M_allocated_capacity + 1));
      psVar17 = local_308;
    }
  }
  else {
    std::operator+(&local_300,"    return Create",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_300);
    local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_2a0.name.field_2._M_allocated_capacity = *psVar12;
      local_2a0.name.field_2._8_8_ = plVar9[3];
    }
    else {
      local_2a0.name.field_2._M_allocated_capacity = *psVar12;
      local_2a0.name._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2a0.name._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2a0.name._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
      operator_delete(local_2a0.name._M_dataplus._M_p,
                      local_2a0.name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,
                      (ulong)(local_300.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::string::append((char *)local_308);
    ppFVar18 = (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppFVar18 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        pFVar4 = *ppFVar18;
        if (pFVar4->deprecated == false) {
          Name_abi_cxx11_(&local_2a0.name,this,pFVar4);
          if ((local_2a0.name._M_string_length ==
               (struct_def->super_Definition).name._M_string_length) &&
             ((local_2a0.name._M_string_length == 0 ||
              (iVar8 = bcmp(local_2a0.name._M_dataplus._M_p,
                            (struct_def->super_Definition).name._M_dataplus._M_p,
                            local_2a0.name._M_string_length), iVar8 == 0)))) {
            std::__cxx11::string::append((char *)&local_2a0);
          }
          BVar3 = (pFVar4->value).type.base_type;
          switch(BVar3) {
          case BASE_TYPE_STRING:
          case BASE_TYPE_VECTOR:
          case BASE_TYPE_UNION:
switchD_001bee26_caseD_d:
            std::__cxx11::string::append((char *)local_308);
            std::operator+(&local_300,"      _",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pFVar4);
            std::__cxx11::string::_M_append((char *)local_308,(ulong)local_300._M_dataplus._M_p);
            break;
          case BASE_TYPE_STRUCT:
            if (struct_def->fixed == true) {
              pSVar5 = (pFVar4->value).type.struct_def;
              std::operator+(&local_300,"      _",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pFVar4);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_300);
              local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_150.field_2._M_allocated_capacity = *psVar12;
                local_150.field_2._8_8_ = plVar9[3];
              }
              else {
                local_150.field_2._M_allocated_capacity = *psVar12;
                local_150._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_150._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              GenStructPackCall_ObjectAPI(this,pSVar5,local_308,&local_150);
              uVar20 = local_150.field_2._M_allocated_capacity;
              _Var21._M_p = local_150._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2) {
LAB_001bf1c9:
                operator_delete(_Var21._M_p,uVar20 + 1);
              }
              break;
            }
            std::__cxx11::string::append((char *)local_308);
            if (((pFVar4->value).type.struct_def)->fixed != true) {
              std::operator+(&local_300,"      _",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pFVar4);
              std::__cxx11::string::_M_append((char *)local_308,(ulong)local_300._M_dataplus._M_p);
              break;
            }
            if (local_1d8->generate_object_based_api == true) {
              std::operator+(&local_300,"      _o.",&local_2a0.name);
              std::__cxx11::string::_M_append((char *)local_308,(ulong)local_300._M_dataplus._M_p);
              break;
            }
            GenTypeGet_abi_cxx11_(&local_2c0,this,&(pFVar4->value).type);
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,0x369857);
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_348.field_2._M_allocated_capacity = *puVar13;
              local_348.field_2._8_8_ = puVar10[3];
            }
            else {
              local_348.field_2._M_allocated_capacity = *puVar13;
              local_348._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_348._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
            local_378._0_8_ = local_378 + 0x10;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_378._16_8_ = *puVar13;
              _uStack_360 = puVar10[3];
            }
            else {
              local_378._16_8_ = *puVar13;
              local_378._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar10;
            }
            local_378._8_8_ = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       (local_378,(ulong)local_2a0.name._M_dataplus._M_p);
            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_258.field_2._M_allocated_capacity = *psVar12;
              local_258.field_2._8_8_ = plVar9[3];
            }
            else {
              local_258.field_2._M_allocated_capacity = *psVar12;
              local_258._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_258._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
            local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_300.field_2._M_allocated_capacity = *puVar13;
              local_300.field_2._8_8_ = puVar10[3];
            }
            else {
              local_300.field_2._M_allocated_capacity = *puVar13;
              local_300._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_300._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_308,(ulong)local_300._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_300._M_dataplus._M_p != &local_300.field_2) {
              operator_delete(local_300._M_dataplus._M_p,
                              (ulong)(local_300.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
              operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,
                              (ulong)(local_348.field_2._M_allocated_capacity + 1));
            }
            uVar20 = local_2c0.field_2._M_allocated_capacity;
            _Var21._M_p = local_2c0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) goto LAB_001bef02;
            goto LAB_001bef0a;
          case BASE_TYPE_ARRAY:
            pSVar5 = (pFVar4->value).type.struct_def;
            if (pSVar5 == (StructDef *)0x0) {
              std::__cxx11::string::append((char *)local_308);
              std::operator+(&local_300,"      _",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pFVar4);
              std::__cxx11::string::_M_append((char *)local_308,(ulong)local_300._M_dataplus._M_p);
            }
            else {
              std::operator+(&local_300,"      _",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pFVar4);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_300);
              local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_170.field_2._M_allocated_capacity = *psVar12;
                local_170.field_2._8_8_ = plVar9[3];
              }
              else {
                local_170.field_2._M_allocated_capacity = *psVar12;
                local_170._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_170._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              GenStructPackCall_ObjectAPI(this,pSVar5,local_308,&local_170);
              uVar20 = local_170.field_2._M_allocated_capacity;
              _Var21._M_p = local_170._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) goto LAB_001bf1c9;
            }
            break;
          default:
            if (BVar3 == BASE_TYPE_UTYPE) goto switchD_001bee26_caseD_d;
            std::__cxx11::string::append((char *)local_308);
            std::operator+(&local_300,"      _o.",&local_2a0.name);
            std::__cxx11::string::_M_append((char *)local_308,(ulong)local_300._M_dataplus._M_p);
          }
          uVar20 = local_300.field_2._M_allocated_capacity;
          _Var21._M_p = local_300._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
LAB_001bef02:
            operator_delete(_Var21._M_p,
                            (ulong)((long)&(((EnumDef *)uVar20)->super_Definition).name._M_dataplus.
                                           _M_p + 1));
          }
LAB_001bef0a:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
            operator_delete(local_2a0.name._M_dataplus._M_p,
                            local_2a0.name.field_2._M_allocated_capacity + 1);
          }
        }
        ppFVar18 = ppFVar18 + 1;
      } while (ppFVar18 !=
               (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    psVar17 = local_308;
    std::__cxx11::string::append((char *)local_308);
  }
  std::__cxx11::string::append((char *)psVar17);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenPackUnPack_ObjectAPI(
      StructDef &struct_def, std::string *code_ptr, const IDLOptions &opts,
      bool struct_has_create,
      const std::set<FieldDef *> &field_has_create) const {
    auto &code = *code_ptr;
    auto struct_name = GenTypeName_ObjectAPI(struct_def.name, opts);
    // UnPack()
    code += "  public " + struct_name + " UnPack() {\n";
    code += "    var _o = new " + struct_name + "();\n";
    code += "    this.UnPackTo(_o);\n";
    code += "    return _o;\n";
    code += "  }\n";
    // UnPackTo()
    code += "  public void UnPackTo(" + struct_name + " _o) {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      auto camel_name = Name(field);
      if (camel_name == struct_def.name) { camel_name += "_"; }
      auto camel_name_short = Name(field);
      auto start = "    _o." + camel_name + " = ";
      switch (field.value.type.base_type) {
        case BASE_TYPE_STRUCT: {
          auto fixed = struct_def.fixed && field.value.type.struct_def->fixed;
          if (fixed) {
            code += start + "this." + camel_name + ".UnPack();\n";
          } else {
            code += start + "this." + camel_name + ".HasValue ? this." +
                    camel_name + ".Value.UnPack() : null;\n";
          }
          break;
        }
        case BASE_TYPE_ARRAY: {
          auto type_name = GenTypeGet_ObjectAPI(field.value.type, opts);
          auto length_str = NumToString(field.value.type.fixed_length);
          auto unpack_method = field.value.type.struct_def == nullptr ? ""
                               : field.value.type.struct_def->fixed
                                   ? ".UnPack()"
                                   : "?.UnPack()";
          code += start + "new " + type_name.substr(0, type_name.length() - 1) +
                  length_str + "];\n";
          code += "    for (var _j = 0; _j < " + length_str + "; ++_j) { _o." +
                  camel_name + "[_j] = this." + camel_name + "(_j)" +
                  unpack_method + "; }\n";
          break;
        }
        case BASE_TYPE_VECTOR:
          if (field.value.type.element == BASE_TYPE_UNION) {
            code += start + "new " +
                    GenTypeGet_ObjectAPI(field.value.type, opts) + "();\n";
            code += "    for (var _j = 0; _j < this." + camel_name +
                    "Length; ++_j) {\n";
            GenUnionUnPack_ObjectAPI(*field.value.type.enum_def, code_ptr,
                                     camel_name, camel_name_short, true);
            code += "    }\n";
          } else if (field.value.type.element != BASE_TYPE_UTYPE) {
            auto fixed = field.value.type.struct_def == nullptr;
            code += start + "new " +
                    GenTypeGet_ObjectAPI(field.value.type, opts) + "();\n";
            code += "    for (var _j = 0; _j < this." + camel_name +
                    "Length; ++_j) {";
            code += "_o." + camel_name + ".Add(";
            if (fixed) {
              code += "this." + camel_name + "(_j)";
            } else {
              code += "this." + camel_name + "(_j).HasValue ? this." +
                      camel_name + "(_j).Value.UnPack() : null";
            }
            code += ");}\n";
          }
          break;
        case BASE_TYPE_UTYPE: break;
        case BASE_TYPE_UNION: {
          GenUnionUnPack_ObjectAPI(*field.value.type.enum_def, code_ptr,
                                   camel_name, camel_name_short, false);
          break;
        }
        default: {
          code += start + "this." + camel_name + ";\n";
          break;
        }
      }
    }
    code += "  }\n";
    // Pack()
    code += "  public static " + GenOffsetType(struct_def) +
            " Pack(FlatBufferBuilder builder, " + struct_name + " _o) {\n";
    code += "    if (_o == null) return default(" + GenOffsetType(struct_def) +
            ");\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      auto camel_name = Name(field);
      if (camel_name == struct_def.name) { camel_name += "_"; }
      auto camel_name_short = Name(field);
      // pre
      switch (field.value.type.base_type) {
        case BASE_TYPE_STRUCT: {
          if (!field.value.type.struct_def->fixed) {
            code += "    var _" + field.name + " = _o." + camel_name +
                    " == null ? default(" +
                    GenOffsetType(*field.value.type.struct_def) +
                    ") : " + GenTypeGet(field.value.type) +
                    ".Pack(builder, _o." + camel_name + ");\n";
          } else if (struct_def.fixed && struct_has_create) {
            std::vector<FieldArrayLength> array_lengths;
            FieldArrayLength tmp_array_length = {
              field.name,
              field.value.type.fixed_length,
            };
            array_lengths.push_back(tmp_array_length);
            GenStructPackDecl_ObjectAPI(*field.value.type.struct_def, code_ptr,
                                        array_lengths);
          }
          break;
        }
        case BASE_TYPE_STRING: {
          std::string create_string =
              field.shared ? "CreateSharedString" : "CreateString";
          code += "    var _" + field.name + " = _o." + camel_name +
                  " == null ? default(StringOffset) : "
                  "builder." +
                  create_string + "(_o." + camel_name + ");\n";
          break;
        }
        case BASE_TYPE_VECTOR: {
          if (field_has_create.find(&field) != field_has_create.end()) {
            auto property_name = camel_name;
            auto gen_for_loop = true;
            std::string array_name = "__" + field.name;
            std::string array_type = "";
            std::string to_array = "";
            switch (field.value.type.element) {
              case BASE_TYPE_STRING: {
                std::string create_string =
                    field.shared ? "CreateSharedString" : "CreateString";
                array_type = "StringOffset";
                to_array += "builder." + create_string + "(_o." +
                            property_name + "[_j])";
                break;
              }
              case BASE_TYPE_STRUCT:
                array_type = "Offset<" + GenTypeGet(field.value.type) + ">";
                to_array = GenTypeGet(field.value.type) + ".Pack(builder, _o." +
                           property_name + "[_j])";
                break;
              case BASE_TYPE_UTYPE:
                property_name = camel_name.substr(0, camel_name.size() - 4);
                array_type = NamespacedName(*field.value.type.enum_def);
                to_array = "_o." + property_name + "[_j].Type";
                break;
              case BASE_TYPE_UNION:
                array_type = "int";
                to_array = NamespacedName(*field.value.type.enum_def) +
                           "Union.Pack(builder,  _o." + property_name + "[_j])";
                break;
              default: gen_for_loop = false; break;
            }
            code += "    var _" + field.name + " = default(VectorOffset);\n";
            code += "    if (_o." + property_name + " != null) {\n";
            if (gen_for_loop) {
              code += "      var " + array_name + " = new " + array_type +
                      "[_o." + property_name + ".Count];\n";
              code += "      for (var _j = 0; _j < " + array_name +
                      ".Length; ++_j) { ";
              code += array_name + "[_j] = " + to_array + "; }\n";
            } else {
              code += "      var " + array_name + " = _o." + property_name +
                      ".ToArray();\n";
            }
            code += "      _" + field.name + " = Create" + camel_name_short +
                    "Vector(builder, " + array_name + ");\n";
            code += "    }\n";
          } else {
            auto pack_method =
                field.value.type.struct_def == nullptr
                    ? "builder.Add" + GenMethod(field.value.type.VectorType()) +
                          "(_o." + camel_name + "[_j]);"
                    : GenTypeGet(field.value.type) + ".Pack(builder, _o." +
                          camel_name + "[_j]);";
            code += "    var _" + field.name + " = default(VectorOffset);\n";
            code += "    if (_o." + camel_name + " != null) {\n";
            code += "      Start" + camel_name_short + "Vector(builder, _o." +
                    camel_name + ".Count);\n";
            code += "      for (var _j = _o." + camel_name +
                    ".Count - 1; _j >= 0; --_j) { " + pack_method + " }\n";
            code += "      _" + field.name + " = builder.EndVector();\n";
            code += "    }\n";
          }
          break;
        }
        case BASE_TYPE_ARRAY: {
          if (field.value.type.struct_def != nullptr) {
            std::vector<FieldArrayLength> array_lengths;
            FieldArrayLength tmp_array_length = {
              field.name,
              field.value.type.fixed_length,
            };
            array_lengths.push_back(tmp_array_length);
            GenStructPackDecl_ObjectAPI(*field.value.type.struct_def, code_ptr,
                                        array_lengths);
          } else {
            code += "    var _" + field.name + " = _o." + camel_name + ";\n";
          }
          break;
        }
        case BASE_TYPE_UNION: {
          code += "    var _" + field.name + "_type = _o." + camel_name +
                  " == null ? " + NamespacedName(*field.value.type.enum_def) +
                  ".NONE : " + "_o." + camel_name + ".Type;\n";
          code +=
              "    var _" + field.name + " = _o." + camel_name +
              " == null ? 0 : " + GenTypeGet_ObjectAPI(field.value.type, opts) +
              ".Pack(builder, _o." + camel_name + ");\n";
          break;
        }
        default: break;
      }
    }
    if (struct_has_create) {
      // Create
      code += "    return Create" + struct_def.name + "(\n";
      code += "      builder";
      for (auto it = struct_def.fields.vec.begin();
           it != struct_def.fields.vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) continue;
        auto camel_name = Name(field);
        if (camel_name == struct_def.name) { camel_name += "_"; }
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            if (struct_def.fixed) {
              GenStructPackCall_ObjectAPI(*field.value.type.struct_def,
                                          code_ptr,
                                          "      _" + field.name + "_");
            } else {
              code += ",\n";
              if (field.value.type.struct_def->fixed) {
                if (opts.generate_object_based_api)
                  code += "      _o." + camel_name;
                else
                  code += "      " + GenTypeGet(field.value.type) +
                          ".Pack(builder, _o." + camel_name + ")";
              } else {
                code += "      _" + field.name;
              }
            }
            break;
          }
          case BASE_TYPE_ARRAY: {
            if (field.value.type.struct_def != nullptr) {
              GenStructPackCall_ObjectAPI(*field.value.type.struct_def,
                                          code_ptr,
                                          "      _" + field.name + "_");
            } else {
              code += ",\n";
              code += "      _" + field.name;
            }
            break;
          }
          case BASE_TYPE_UNION: FLATBUFFERS_FALLTHROUGH();   // fall thru
          case BASE_TYPE_UTYPE: FLATBUFFERS_FALLTHROUGH();   // fall thru
          case BASE_TYPE_STRING: FLATBUFFERS_FALLTHROUGH();  // fall thru
          case BASE_TYPE_VECTOR: {
            code += ",\n";
            code += "      _" + field.name;
            break;
          }
          default:  // scalar
            code += ",\n";
            code += "      _o." + camel_name;
            break;
        }
      }
      code += ");\n";
    } else {
      // Start, End
      code += "    Start" + struct_def.name + "(builder);\n";
      for (auto it = struct_def.fields.vec.begin();
           it != struct_def.fields.vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) continue;
        auto camel_name = Name(field);
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            if (field.value.type.struct_def->fixed) {
              code += "    Add" + camel_name + "(builder, " +
                      GenTypeGet(field.value.type) + ".Pack(builder, _o." +
                      camel_name + "));\n";
            } else {
              code +=
                  "    Add" + camel_name + "(builder, _" + field.name + ");\n";
            }
            break;
          }
          case BASE_TYPE_STRING: FLATBUFFERS_FALLTHROUGH();  // fall thru
          case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();   // fall thru
          case BASE_TYPE_VECTOR: {
            code +=
                "    Add" + camel_name + "(builder, _" + field.name + ");\n";
            break;
          }
          case BASE_TYPE_UTYPE: break;
          case BASE_TYPE_UNION: {
            code += "    Add" + camel_name + "Type(builder, _" + field.name +
                    "_type);\n";
            code +=
                "    Add" + camel_name + "(builder, _" + field.name + ");\n";
            break;
          }
          // scalar
          default: {
            code +=
                "    Add" + camel_name + "(builder, _o." + camel_name + ");\n";
            break;
          }
        }
      }
      code += "    return End" + struct_def.name + "(builder);\n";
    }
    code += "  }\n";
  }